

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                   *this,Index currentIndex)

{
  Index *pIVar1;
  uint uVar2;
  undefined1 *puVar3;
  pointer pIVar4;
  ulong uVar5;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_38;
  pair<unsigned_int,_unsigned_int> local_28;
  
  local_38._M_array = &local_28;
  local_28.second = 1;
  local_38._M_len = 1;
  uVar2 = (this->mirrorMatrixU_).nextInsertIndex_;
  uVar5 = ((long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_28.first = currentIndex;
  if (uVar5 < uVar2 || uVar5 - uVar2 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
    ::resize(&(this->mirrorMatrixU_).matrix_,(ulong)(uVar2 + 1));
  }
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
  ::_container_insert<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>
              *)&this->mirrorMatrixU_,&local_38,uVar2,0);
  pIVar1 = &(this->mirrorMatrixU_).nextInsertIndex_;
  *pIVar1 = *pIVar1 + 1;
  pIVar4 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined1 **)&pIVar4[currentIndex].column_.super_type.data_.root_plus_size_;
  if ((Column_support *)puVar3 != &pIVar4[currentIndex].column_ && puVar3 != (undefined1 *)0x0) {
    uVar2 = *(uint *)&(*(node_ptr *)((long)&pIVar4[currentIndex].column_.super_type.data_ + 8))[1].
                      next_;
    if (((ulong)uVar2 != 0xffffffff) &&
       ((ulong)((long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar2)) {
      local_38._M_array = (iterator)CONCAT44(local_38._M_array._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->pivotToColumnIndex_,(ulong)(uVar2 * 2 + 2),(value_type_conflict *)&local_38)
      ;
      pIVar4 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  puVar3 = *(undefined1 **)&pIVar4[currentIndex].column_.super_type.data_.root_plus_size_;
  if (puVar3 == (undefined1 *)0x0 || (Column_support *)puVar3 == &pIVar4[currentIndex].column_) {
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
    ::_add_bar(&this->super_RU_pairing_option,
               pIVar4[currentIndex].super_Column_dimension_option.dim_,this->nextEventIndex_);
  }
  else {
    _reduce_column(this,currentIndex,this->nextEventIndex_);
  }
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}